

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::flush(CVmFormatter *this,vm_nl_type nl)

{
  wchar_t *__s;
  os_color_t oVar1;
  long lVar2;
  undefined4 uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  vm_nl_type nl_00;
  size_t cnt;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  __s = this->linebuf_;
  this->linebuf_[this->linepos_] = L'\0';
  expand_pending_tab(this,(uint)(nl == VM_NL_NEWLINE));
  sVar4 = wcslen(__s);
  uVar8 = (uint)sVar4;
  if ((nl != VM_NL_INPUT) && (nl != VM_NL_NONE_INTERNAL)) {
    uVar5 = sVar4 & 0xffffffff;
    uVar6 = (int)uVar8 >> 0x1f & uVar8;
    uVar7 = uVar8 + 1;
    do {
      uVar8 = uVar6;
      if (((int)(uint)uVar5 < 1) || (uVar8 = (uint)uVar5, this->linebuf_[uVar5 - 1] != L' ')) break;
      uVar8 = uVar7 - 1;
      lVar2 = uVar5 - 1;
      uVar5 = uVar5 - 1;
      uVar7 = uVar8;
    } while ((this->flagbuf_[lVar2] & 1) == 0);
    if (nl == VM_NL_NEWLINE) {
      this->linepos_ = uVar8;
    }
  }
  if (nl == VM_NL_OSNEWLINE) {
    nl_00 = VM_NL_OSNEWLINE;
  }
  else if (nl == VM_NL_NEWLINE) {
    nl_00 = VM_NL_NEWLINE;
    if (this->linecol_ == 0) {
      nl_00 = (uint)(0 < this->html_pre_level_ || (this->field_0xef81 & 0x20) == 0) * 2;
    }
  }
  else {
    nl_00 = VM_NL_NONE;
    if (nl == VM_NL_INPUT) {
      this->html_passthru_state_ = VMCON_HPS_NORMAL;
      nl_00 = VM_NL_NONE;
    }
  }
  cnt = (size_t)(int)uVar8;
  if ((uVar8 != 0) ||
     (((this->linecol_ != 0 && ((this->field_0xef81 & 0x20) == 0)) || (0 < this->html_pre_level_))))
  {
    write_text(this,__s,cnt,this->colorbuf_,nl_00);
  }
  if (nl < VM_NL_NEWLINE) {
    (*this->_vptr_CVmFormatter[9])(this);
  }
  else if (nl != VM_NL_NONE_INTERNAL) {
    this->linecol_ = 0;
    bVar10 = false;
    goto LAB_00244490;
  }
  bVar10 = this->linecol_ != 0;
LAB_00244490:
  this->is_continuation_ = (uint)bVar10;
  iVar9 = this->linepos_ - uVar8;
  if (iVar9 != 0 && (int)uVar8 <= this->linepos_) {
    sVar4 = (size_t)iVar9;
    memmove(__s,__s + cnt,sVar4 * 4);
    memmove(this->colorbuf_,this->colorbuf_ + cnt,sVar4 * 0x18);
    memmove(this->flagbuf_,this->flagbuf_ + cnt,sVar4);
  }
  this->linepos_ = iVar9;
  if (nl == VM_NL_NEWLINE) {
    this->field_0xef81 = this->field_0xef81 | 0x20;
  }
  else if (uVar8 != 0) {
    this->field_0xef81 = this->field_0xef81 & 0xdf;
  }
  if ((((this->cur_color_).fg != (this->os_color_).fg) ||
      ((this->cur_color_).bg != (this->os_color_).bg)) ||
     ((this->cur_color_).attr != (this->os_color_).attr)) {
    if ((this->cur_color_).attr != (this->os_color_).attr) {
      (*this->_vptr_CVmFormatter[7])(this);
    }
    oVar1 = (this->cur_color_).fg;
    if ((oVar1 != (this->os_color_).fg) || ((this->cur_color_).bg != (this->os_color_).bg)) {
      (*this->_vptr_CVmFormatter[5])(this,oVar1,(this->cur_color_).bg);
    }
    uVar3 = *(undefined4 *)&(this->cur_color_).field_0x14;
    (this->os_color_).attr = (this->cur_color_).attr;
    *(undefined4 *)&(this->os_color_).field_0x14 = uVar3;
    oVar1 = (this->cur_color_).bg;
    (this->os_color_).fg = (this->cur_color_).fg;
    (this->os_color_).bg = oVar1;
  }
  return;
}

Assistant:

void CVmFormatter::flush(VMG_ vm_nl_type nl)
{
    int cnt;
    vm_nl_type write_nl;

    /* null-terminate the current output line buffer */
    linebuf_[linepos_] = '\0';

    /* 
     *   Expand any pending tab.  Allow "anonymous" tabs only if we're
     *   flushing because we're ending the line normally; if we're not
     *   ending the line, we can't handle tabs that depend on the line
     *   ending. 
     */
    expand_pending_tab(vmg_ nl == VM_NL_NEWLINE);

    /* 
     *   note number of characters to display - assume we'll display all of
     *   the characters in the buffer 
     */
    cnt = wcslen(linebuf_);

    /* 
     *   Trim trailing spaces, unless we're about to read input or are doing
     *   an internal flush.  (Show trailing spaces when reading input, since
     *   we won't be able to revise the layout after this point.  Don't trim
     *   on an internal flush either, as this kind of flushing simply empties
     *   out our buffer exactly as it is.)  
     */
    if (nl != VM_NL_INPUT && nl != VM_NL_NONE_INTERNAL)
    {
        /* 
         *   look for last non-space character, but keep any spaces that come
         *   before an explicit non-breaking flag 
         */
        for ( ; cnt > 0 && linebuf_[cnt-1] == ' ' ; --cnt)
        {
            /* don't remove this character if it's marked as non-breaking */
            if ((flagbuf_[cnt-1] & VMCON_OBF_NOBREAK) != 0)
                break;
        }

        /* 
         *   if we're actually doing a newline, discard the trailing spaces
         *   for good - we don't want them at the start of the next line 
         */
        if (nl == VM_NL_NEWLINE)
            linepos_ = cnt;
    }

    /* check the newline mode */
    switch(nl)
    {
    case VM_NL_NONE:
    case VM_NL_NONE_INTERNAL:
        /* no newline - just flush out what we have */
        write_nl = VM_NL_NONE;
        break;

    case VM_NL_INPUT:
        /* no newline - flush out what we have */
        write_nl = VM_NL_NONE;

        /* on input, reset the HTML parsing state */
        html_passthru_state_ = VMCON_HPS_NORMAL;
        break;

    case VM_NL_NEWLINE:
        /* 
         *   We're adding a newline.  We want to suppress redundant
         *   newlines -- we reduce any run of consecutive vertical
         *   whitespace to a single newline.  So, if we have anything in
         *   this line, or we didn't already just write a newline, write
         *   out a newline now; otherwise, write nothing.  
         */
        if (linecol_ != 0 || !just_did_nl_ || html_pre_level_ > 0)
        {
            /* add the newline */
            write_nl = VM_NL_NEWLINE;
        }
        else
        {
            /* 
             *   Don't write out a newline after all - the line buffer is
             *   empty, and we just wrote a newline, so this is a
             *   redundant newline that we wish to suppress (so that we
             *   collapse a run of vertical whitespace down to a single
             *   newline).  
             */
            write_nl = VM_NL_NONE;
        }
        break;

    case VM_NL_OSNEWLINE:
        /* 
         *   we're going to depend on the underlying OS output layer to do
         *   line breaking, so we won't add a newline, but we will add a
         *   space, so that the underlying OS layer knows we have a word
         *   break here 
         */
        write_nl = VM_NL_OSNEWLINE;
        break;
    }

    /* 
     *   display the line, as long as we have something buffered to
     *   display; even if we don't, display it if our column is non-zero
     *   and we didn't just do a newline, since this must mean that we've
     *   flushed a partial line and are just now doing the newline 
     */
    if (cnt != 0 || (linecol_ != 0 && !just_did_nl_)
        || html_pre_level_ > 0)
    {
        /* write it out */
        write_text(vmg_ linebuf_, cnt, colorbuf_, write_nl);
    }

    /* check the line ending */
    switch (nl)
    {
    case VM_NL_NONE:
    case VM_NL_INPUT:
        /* we're not displaying a newline, so flush what we have */
        flush_to_os();

        /* 
         *   the subsequent buffer will be a continuation of the current
         *   text, if we've displayed anything at all here 
         */
        is_continuation_ = (linecol_ != 0);
        break;

    case VM_NL_NONE_INTERNAL:
        /* 
         *   internal buffer flush only - subsequent text will be a
         *   continuation of the current line, if there's anything on the
         *   current line 
         */
        is_continuation_ = (linecol_ != 0);
        break;

    default:
        /* we displayed a newline, so reset the column position */
        linecol_ = 0;

        /* the next buffer starts a new line on the display */
        is_continuation_ = FALSE;
        break;
    }

    /* 
     *   Move any trailing characters we didn't write in this go to the start
     *   of the buffer.  
     */
    if (cnt < linepos_)
    {
        size_t movecnt;

        /* calculate how many trailing characters we didn't write */
        movecnt = linepos_ - cnt;

        /* move the characters, colors, and flags */
        memmove(linebuf_, linebuf_ + cnt, movecnt * sizeof(linebuf_[0]));
        memmove(colorbuf_, colorbuf_ + cnt, movecnt * sizeof(colorbuf_[0]));
        memmove(flagbuf_, flagbuf_ + cnt, movecnt * sizeof(flagbuf_[0]));
    }

    /* move the line output position to follow the preserved characters */
    linepos_ -= cnt;

    /* 
     *   If we just output a newline, note it.  If we didn't just output a
     *   newline, but we did write out anything else, note that we're no
     *   longer at the start of a line on the underlying output device.  
     */
    if (nl == VM_NL_NEWLINE)
        just_did_nl_ = TRUE;
    else if (cnt != 0)
        just_did_nl_ = FALSE;

    /* 
     *   if the current buffering color doesn't match the current osifc-layer
     *   color, then we must need to flush just the new color/attribute
     *   settings (this can happen when we have changed the attributes in
     *   preparation for reading input, since we won't have any actual text
     *   to write after the color change) 
     */
    if (!cur_color_.equals(&os_color_))
    {
        /* set the text attributes in the OS window, if they changed */
        if (cur_color_.attr != os_color_.attr)
            set_os_text_attr(cur_color_.attr);

        /* set the color in the OS window, if it changed */
        if (cur_color_.fg != os_color_.fg
            || cur_color_.bg != os_color_.bg)
            set_os_text_color(cur_color_.fg, cur_color_.bg);

        /* set the new osifc color */
        os_color_ = cur_color_;
    }
}